

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O0

void FAudio_INTERNAL_AllocEffectChain(FAudioVoice *voice,FAudioEffectChain *pEffectChain)

{
  long lVar1;
  uint *in_RSI;
  long *in_RDI;
  uint32_t i;
  uint local_14;
  
  *(undefined4 *)(in_RDI + 9) = 1;
  *(uint *)((long)in_RDI + 0x4c) = *in_RSI;
  if (*(int *)((long)in_RDI + 0x4c) != 0) {
    for (local_14 = 0; local_14 < *in_RSI; local_14 = local_14 + 1) {
      (*(code *)**(undefined8 **)(*(long *)(in_RSI + 1) + (ulong)local_14 * 0x10))
                (*(undefined8 *)(*(long *)(in_RSI + 1) + (ulong)local_14 * 0x10));
    }
    lVar1 = (**(code **)(*in_RDI + 0xb8))((ulong)*(uint *)((long)in_RDI + 0x4c) << 4);
    in_RDI[10] = lVar1;
    SDL_memcpy(in_RDI[10],*(undefined8 *)(in_RSI + 1),(ulong)*(uint *)((long)in_RDI + 0x4c) << 4);
    lVar1 = (**(code **)(*in_RDI + 0xb8))((ulong)*(uint *)((long)in_RDI + 0x4c) << 3);
    in_RDI[0xb] = lVar1;
    SDL_memset(in_RDI[0xb],0,(ulong)*(uint *)((long)in_RDI + 0x4c) << 3);
    lVar1 = (**(code **)(*in_RDI + 0xb8))((ulong)*(uint *)((long)in_RDI + 0x4c) << 2);
    in_RDI[0xc] = lVar1;
    SDL_memset(in_RDI[0xc],0,(ulong)*(uint *)((long)in_RDI + 0x4c) << 2);
    lVar1 = (**(code **)(*in_RDI + 0xb8))(*(undefined4 *)((long)in_RDI + 0x4c));
    in_RDI[0xd] = lVar1;
    SDL_memset(in_RDI[0xd],0,*(undefined4 *)((long)in_RDI + 0x4c));
    lVar1 = (**(code **)(*in_RDI + 0xb8))(*(undefined4 *)((long)in_RDI + 0x4c));
    in_RDI[0xe] = lVar1;
    SDL_memset(in_RDI[0xe],0,*(undefined4 *)((long)in_RDI + 0x4c));
  }
  return;
}

Assistant:

void FAudio_INTERNAL_AllocEffectChain(
	FAudioVoice *voice,
	const FAudioEffectChain *pEffectChain
) {
	uint32_t i;

	LOG_FUNC_ENTER(voice->audio)
	voice->effects.state = FAPO_BUFFER_VALID;
	voice->effects.count = pEffectChain->EffectCount;
	if (voice->effects.count == 0)
	{
		LOG_FUNC_EXIT(voice->audio)
		return;
	}

	for (i = 0; i < pEffectChain->EffectCount; i += 1)
	{
		pEffectChain->pEffectDescriptors[i].pEffect->AddRef(pEffectChain->pEffectDescriptors[i].pEffect);
	}

	voice->effects.desc = (FAudioEffectDescriptor*) voice->audio->pMalloc(
		voice->effects.count * sizeof(FAudioEffectDescriptor)
	);
	FAudio_memcpy(
		voice->effects.desc,
		pEffectChain->pEffectDescriptors,
		voice->effects.count * sizeof(FAudioEffectDescriptor)
	);
	#define ALLOC_EFFECT_PROPERTY(prop, type) \
		voice->effects.prop = (type*) voice->audio->pMalloc( \
			voice->effects.count * sizeof(type) \
		); \
		FAudio_zero( \
			voice->effects.prop, \
			voice->effects.count * sizeof(type) \
		);
	ALLOC_EFFECT_PROPERTY(parameters, void*)
	ALLOC_EFFECT_PROPERTY(parameterSizes, uint32_t)
	ALLOC_EFFECT_PROPERTY(parameterUpdates, uint8_t)
	ALLOC_EFFECT_PROPERTY(inPlaceProcessing, uint8_t)
	#undef ALLOC_EFFECT_PROPERTY
	LOG_FUNC_EXIT(voice->audio)
}